

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDebug.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkAutoDebugModify(Abc_Ntk_t *pNtkInit,int Step,int fConst1)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *local_50;
  Abc_Obj_t *pConst;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  int fConst1_local;
  int Step_local;
  Abc_Ntk_t *pNtkInit_local;
  
  pNtk._0_4_ = fConst1;
  pNtk._4_4_ = Step;
  _fConst1_local = pNtkInit;
  pObj = (Abc_Obj_t *)Abc_NtkDup(pNtkInit);
  iVar1 = Abc_NtkNodeNum((Abc_Ntk_t *)pObj);
  iVar2 = Abc_NtkNodeNum(_fConst1_local);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkNodeNum(pNtk) == Abc_NtkNodeNum(pNtkInit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDebug.c"
                  ,0xba,"Abc_Ntk_t *Abc_NtkAutoDebugModify(Abc_Ntk_t *, int, int)");
  }
  Abc_NtkFindGivenFanin((Abc_Ntk_t *)pObj,pNtk._4_4_,&pFanin,&pConst);
  iVar1 = Abc_ObjIsPo(pFanin);
  if ((iVar1 != 0) && (iVar1 = Abc_NodeIsConst(pConst), iVar1 != 0)) {
    Abc_NtkDeleteAll_rec(pFanin);
    return (Abc_Ntk_t *)pObj;
  }
  if ((int)pNtk == 0) {
    local_50 = Abc_NtkCreateNodeConst0((Abc_Ntk_t *)pObj);
  }
  else {
    local_50 = Abc_NtkCreateNodeConst1((Abc_Ntk_t *)pObj);
  }
  Abc_ObjTransferFanout(pConst,local_50);
  Abc_NtkDeleteAll_rec(pConst);
  Abc_NtkSweep((Abc_Ntk_t *)pObj,0);
  Abc_NtkCleanupSeq((Abc_Ntk_t *)pObj,0,0,0);
  Abc_NtkToSop((Abc_Ntk_t *)pObj,-1,1000000000);
  Abc_NtkCycleInitStateSop((Abc_Ntk_t *)pObj,0x32,0);
  return (Abc_Ntk_t *)pObj;
}

Assistant:

Abc_Ntk_t * Abc_NtkAutoDebugModify( Abc_Ntk_t * pNtkInit, int Step, int fConst1 )
{
    extern void Abc_NtkCycleInitStateSop( Abc_Ntk_t * pNtk, int nFrames, int fVerbose );
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pFanin, * pConst;
    // copy the network
    pNtk = Abc_NtkDup( pNtkInit );
    assert( Abc_NtkNodeNum(pNtk) == Abc_NtkNodeNum(pNtkInit) );
    // find the object number
    Abc_NtkFindGivenFanin( pNtk, Step, &pObj, &pFanin );
    // consider special case 
    if ( Abc_ObjIsPo(pObj) && Abc_NodeIsConst(pFanin) )
    {
        Abc_NtkDeleteAll_rec( pObj );
        return pNtk;
    }
    // plug in a constant node
    pConst = fConst1? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
    Abc_ObjTransferFanout( pFanin, pConst );
    Abc_NtkDeleteAll_rec( pFanin );

    Abc_NtkSweep( pNtk, 0 );
    Abc_NtkCleanupSeq( pNtk, 0, 0, 0 );
    Abc_NtkToSop( pNtk, -1, ABC_INFINITY );
    Abc_NtkCycleInitStateSop( pNtk, 50, 0 );
    return pNtk;
}